

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall TPZMatrix<float>::Subst_Backward(TPZMatrix<float> *this,TPZFMatrix<float> *B)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  undefined4 extraout_var_01;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  float extraout_XMM0_Da;
  float fVar8;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float local_34;
  int extraout_var_00;
  
  lVar3 = (B->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
  iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  iVar4 = 0;
  if ((lVar3 == CONCAT44(extraout_var,iVar2)) && ((this->super_TPZBaseMatrix).fDecomposed == '\x03')
     ) {
    iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    lVar3 = CONCAT44(extraout_var_00,iVar2);
    iVar4 = 1;
    if (lVar3 != 0 && -1 < extraout_var_00) {
      do {
        lVar6 = lVar3 + -1;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar6,lVar6);
        if (0 < (B->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol) {
          lVar7 = 0;
          do {
            iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
            lVar5 = CONCAT44(extraout_var_01,iVar2);
            fVar8 = 0.0;
            while (lVar3 < lVar5) {
              lVar5 = lVar5 + -1;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,lVar6,lVar5);
              (*(B->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
                [0x24])(B,lVar5,lVar7);
              fVar8 = fVar8 + extraout_XMM0_Da_01 * extraout_XMM0_Da_00;
            }
            (*(B->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0x24])(B,lVar6,lVar7);
            local_34 = (extraout_XMM0_Da_02 - fVar8) / extraout_XMM0_Da;
            (*(B->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0x23])(B,lVar6,lVar7,&local_34);
            lVar7 = lVar7 + 1;
          } while (lVar7 < (B->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol);
        }
        bVar1 = 1 < lVar3;
        lVar3 = lVar6;
      } while (bVar1);
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

int TPZMatrix<TVar>::Subst_Backward( TPZFMatrix<TVar> *B ) const {
	
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky) return( 0 );
	for ( int64_t r = Dim()-1;  r >= 0;  r-- ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = N, ..., r+1.
			//
			TVar sum = 0.0;
			for ( int64_t i = Dim()-1; i > r; i-- ) sum += GetVal(r, i) * B->GetVal(i, c);
            // Faz B[r,c] = (B[r,c] - sum) / A[r,r].
            //
            B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
        }
    }
    return( 1 );
}